

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::RunContext::handleUnfinishedSections(RunContext *this)

{
  bool bVar1;
  reference pSVar2;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  *in_RDI;
  const_reverse_iterator itEnd;
  const_reverse_iterator it;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
  *in_stack_ffffffffffffffc8;
  vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *in_stack_ffffffffffffffd8;
  
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rbegin
            (in_stack_ffffffffffffffd8);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
            (in_RDI,(reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
                     *)in_stack_ffffffffffffffc8);
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::rend
            (in_stack_ffffffffffffffd8);
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_const*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
  ::
  reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo*,std::vector<Catch::SectionEndInfo,std::allocator<Catch::SectionEndInfo>>>>
            (in_RDI,(reverse_iterator<__gnu_cxx::__normal_iterator<Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
                     *)in_stack_ffffffffffffffc8);
  while( true ) {
    bVar1 = std::operator!=(in_RDI,in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    pSVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
             ::operator*(in_RDI);
    (**(code **)&(((in_RDI->current)._M_current)->sectionInfo).description)(in_RDI,pSVar2);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_Catch::SectionEndInfo_*,_std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>_>_>
    ::operator++(in_RDI);
  }
  std::vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_>::clear
            ((vector<Catch::SectionEndInfo,_std::allocator<Catch::SectionEndInfo>_> *)0x1bbc52);
  return;
}

Assistant:

void handleUnfinishedSections() {
            // If sections ended prematurely due to an exception we stored their
            // infos here so we can tear them down outside the unwind process.
            for( std::vector<SectionEndInfo>::const_reverse_iterator it = m_unfinishedSections.rbegin(),
                        itEnd = m_unfinishedSections.rend();
                    it != itEnd;
                    ++it )
                sectionEnded( *it );
            m_unfinishedSections.clear();
        }